

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::UniformCase::writeUniformCompareExpr
          (UniformCase *this,ostringstream *dst,BasicUniform *uniform)

{
  ostream *poVar1;
  VarValue *value;
  int iVar2;
  char *pcVar3;
  string sStack_38;
  
  if (uniform->type - TYPE_SAMPLER_1D < 0x1e) {
    poVar1 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                             "compare_vec4(");
    pcVar3 = "textureCube";
    if (uniform->type == TYPE_SAMPLER_2D) {
      pcVar3 = "texture2D";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    poVar1 = std::operator<<(poVar1,"(");
    poVar1 = std::operator<<(poVar1,(string *)uniform);
    poVar1 = std::operator<<(poVar1,", vec");
    iVar2 = 2;
    if (uniform->type != TYPE_SAMPLER_2D) {
      iVar2 = (uint)(uniform->type == TYPE_SAMPLER_CUBE) * 3;
    }
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::operator<<(poVar1,"(0.0))");
  }
  else {
    poVar1 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"compare_");
    pcVar3 = glu::getDataTypeName(uniform->type);
    poVar1 = std::operator<<(poVar1,pcVar3);
    poVar1 = std::operator<<(poVar1,"(");
    std::operator<<(poVar1,(string *)uniform);
  }
  poVar1 = std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,", ");
  shaderVarValueStr_abi_cxx11_(&sStack_38,(Functional *)&uniform->finalValue,value);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void UniformCase::writeUniformCompareExpr (std::ostringstream& dst, const BasicUniform& uniform) const
{
	if (glu::isDataTypeSampler(uniform.type))
	{
		dst << "compare_vec4("
			<< (uniform.type == glu::TYPE_SAMPLER_2D ? "texture2D" : "textureCube")
			<< "(" << uniform.name << ", vec" << getSamplerNumLookupDimensions(uniform.type) << "(0.0))";
	}
	else
		dst << "compare_" << glu::getDataTypeName(uniform.type) << "(" << uniform.name;

	dst << ", " << shaderVarValueStr(uniform.finalValue) << ")";
}